

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

string * __thiscall
VulkanHppGenerator::generateSizeCheck
          (string *__return_storage_ptr__,VulkanHppGenerator *this,
          vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
          *arrayIts,string *structName,bool mutualExclusiveLens)

{
  pointer p_Var1;
  MemberData *pMVar2;
  _Bit_type *p_Var3;
  bool bVar4;
  int iVar5;
  pointer p_Var6;
  long lVar7;
  ulong uVar8;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  allocator_type local_231;
  string *local_230;
  string secondName;
  string sum;
  string assertionCheck;
  string throwCheck;
  string local_1a8;
  ulong local_188;
  string *local_180;
  ulong local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150 [2];
  string throwText;
  string assertionText;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (8 < (ulong)((long)(arrayIts->
                        super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(arrayIts->
                       super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start)) {
    local_230 = __return_storage_ptr__;
    local_180 = structName;
    if (generateSizeCheck(std::vector<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>,std::allocator<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>>>const&,std::__cxx11::string_const&,bool)
        ::throwTextTemplate_abi_cxx11_ == '\0') {
      iVar5 = __cxa_guard_acquire(&generateSizeCheck(std::vector<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>,std::allocator<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>>>const&,std::__cxx11::string_const&,bool)
                                   ::throwTextTemplate_abi_cxx11_);
      if (iVar5 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   &generateSizeCheck(std::vector<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>,std::allocator<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>>>const&,std::__cxx11::string_const&,bool)
                    ::throwTextTemplate_abi_cxx11_,
                   "      if ( ${throwCheck} )\n      {\n        throw LogicError( VULKAN_HPP_NAMESPACE_STRING\"::${structName}::${structName}: ${throwCheck}\" );\n      }\n"
                   ,(allocator<char> *)local_150);
        __cxa_atexit(std::__cxx11::string::~string,
                     &generateSizeCheck(std::vector<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>,std::allocator<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>>>const&,std::__cxx11::string_const&,bool)
                      ::throwTextTemplate_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&generateSizeCheck(std::vector<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>,std::allocator<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>>>const&,std::__cxx11::string_const&,bool)
                             ::throwTextTemplate_abi_cxx11_);
        __return_storage_ptr__ = local_230;
      }
    }
    assertionText._M_dataplus._M_p = (pointer)&assertionText.field_2;
    assertionText._M_string_length = 0;
    throwText._M_dataplus._M_p = (pointer)&throwText.field_2;
    throwText._M_string_length = 0;
    assertionText.field_2._M_local_buf[0] = '\0';
    throwText.field_2._M_local_buf[0] = '\0';
    if (mutualExclusiveLens) {
      sum._M_dataplus._M_p = (pointer)&sum.field_2;
      sum._M_string_length = 0;
      sum.field_2._M_local_buf[0] = '\0';
      p_Var1 = (arrayIts->
               super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (p_Var6 = (arrayIts->
                    super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; p_Var6 != p_Var1;
          p_Var6 = p_Var6 + 1) {
        pMVar2 = p_Var6->_M_current;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a8,"p",(allocator<char> *)&local_170);
        stripPrefix(&throwCheck,&pMVar2->name,&local_1a8);
        anon_unknown.dwarf_dd40c::startLowerCase(&assertionCheck,&throwCheck);
        std::operator+(&secondName,"!",&assertionCheck);
        std::operator+(&local_150[0].first,&secondName,"_.empty() + ");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&sum,&local_150[0].first);
        std::__cxx11::string::~string((string *)local_150);
        std::__cxx11::string::~string((string *)&secondName);
        std::__cxx11::string::~string((string *)&assertionCheck);
        std::__cxx11::string::~string((string *)&throwCheck);
        std::__cxx11::string::~string((string *)&local_1a8);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                (&sum,sum._M_string_length - 3);
      __return_storage_ptr__ = local_230;
      std::operator+(&secondName,"      VULKAN_HPP_ASSERT( ( ",&sum);
      std::operator+(&local_150[0].first,&secondName," ) <= 1);\n");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&assertionText,&local_150[0].first);
      std::__cxx11::string::~string((string *)local_150);
      std::__cxx11::string::~string((string *)&secondName);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[11],_true>(local_150,(char (*) [11])"structName",local_180);
      std::operator+(&throwCheck,"1 < ( ",&sum);
      std::operator+(&assertionCheck,&throwCheck," )");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (local_150 + 1,(char (*) [11])"throwCheck",&assertionCheck);
      __l_00._M_len = 2;
      __l_00._M_array = local_150;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_90,__l_00,
            (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_1a8,(allocator_type *)&local_170);
      replaceWithMap(&secondName,
                     &generateSizeCheck(std::vector<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>,std::allocator<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>>>const&,std::__cxx11::string_const&,bool)
                      ::throwTextTemplate_abi_cxx11_,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_90);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&throwText,&secondName);
      std::__cxx11::string::~string((string *)&secondName);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_90);
      lVar7 = 0x40;
      do {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&local_150[0].first._M_dataplus._M_p + lVar7));
        lVar7 = lVar7 + -0x40;
      } while (lVar7 != -0x40);
      std::__cxx11::string::~string((string *)&assertionCheck);
      std::__cxx11::string::~string((string *)&throwCheck);
      std::__cxx11::string::~string((string *)&sum);
    }
    else {
      uVar8 = 0;
      while( true ) {
        local_188 = uVar8 + 1;
        p_Var6 = (arrayIts->
                 super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(arrayIts->
                          super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)p_Var6 >> 3) <=
            local_188) break;
        bVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                starts_with(&(p_Var6[uVar8]._M_current)->name,"p");
        if (!bVar4) {
          __assert_fail("arrayIts[first]->name.starts_with( \"p\" )",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x2abf,
                        "std::string VulkanHppGenerator::generateSizeCheck(const std::vector<std::vector<MemberData>::const_iterator> &, const std::string &, bool) const"
                       );
        }
        pMVar2 = (arrayIts->
                 super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[uVar8]._M_current;
        local_178 = uVar8;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&assertionCheck,"p",(allocator<char> *)&throwCheck);
        stripPrefix(&secondName,&pMVar2->name,&assertionCheck);
        __return_storage_ptr__ = local_230;
        anon_unknown.dwarf_dd40c::startLowerCase(&local_150[0].first,&secondName);
        std::operator+(&sum,&local_150[0].first,"_");
        std::__cxx11::string::~string((string *)local_150);
        std::__cxx11::string::~string((string *)&secondName);
        std::__cxx11::string::~string((string *)&assertionCheck);
        for (uVar8 = local_188;
            p_Var6 = (arrayIts->
                     super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
            uVar8 < (ulong)((long)(arrayIts->
                                  super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)p_Var6 >> 3);
            uVar8 = uVar8 + 1) {
          bVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  starts_with(&(p_Var6[uVar8]._M_current)->name,"p");
          if (!bVar4) {
            __assert_fail("arrayIts[second]->name.starts_with( \"p\" )",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                          ,0x2ac3,
                          "std::string VulkanHppGenerator::generateSizeCheck(const std::vector<std::vector<MemberData>::const_iterator> &, const std::string &, bool) const"
                         );
          }
          pMVar2 = (arrayIts->
                   super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar8]._M_current;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&throwCheck,"p",(allocator<char> *)&local_1a8);
          stripPrefix(&assertionCheck,&pMVar2->name,&throwCheck);
          anon_unknown.dwarf_dd40c::startLowerCase(&local_150[0].first,&assertionCheck);
          std::operator+(&secondName,&local_150[0].first,"_");
          std::__cxx11::string::~string((string *)local_150);
          std::__cxx11::string::~string((string *)&assertionCheck);
          std::__cxx11::string::~string((string *)&throwCheck);
          std::operator+(&throwCheck,&sum,".size() == ");
          std::operator+(&local_150[0].first,&throwCheck,&secondName);
          std::operator+(&assertionCheck,&local_150[0].first,".size()");
          std::__cxx11::string::~string((string *)local_150);
          std::__cxx11::string::~string((string *)&throwCheck);
          std::operator+(&local_1a8,&sum,".size() != ");
          std::operator+(&local_150[0].first,&local_1a8,&secondName);
          std::operator+(&throwCheck,&local_150[0].first,".size()");
          std::__cxx11::string::~string((string *)local_150);
          std::__cxx11::string::~string((string *)&local_1a8);
          p_Var6 = (arrayIts->
                   super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pMVar2 = p_Var6[local_178]._M_current;
          p_Var3 = *(_Bit_type **)
                    &(pMVar2->optional).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data;
          if (((p_Var3 == (((_Bit_iterator *)
                           ((long)&(pMVar2->optional).super__Bvector_base<std::allocator<bool>_>.
                                   _M_impl + 0x10))->super__Bit_iterator_base)._M_p) &&
              (*(uint *)((long)&(pMVar2->optional).super__Bvector_base<std::allocator<bool>_>.
                                _M_impl + 0x18) == 0)) || ((*p_Var3 & 1) == 0)) {
            pMVar2 = p_Var6[uVar8]._M_current;
            p_Var3 = *(_Bit_type **)
                      &(pMVar2->optional).super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data;
            if (((p_Var3 != (((_Bit_iterator *)
                             ((long)&(pMVar2->optional).super__Bvector_base<std::allocator<bool>_>.
                                     _M_impl + 0x10))->super__Bit_iterator_base)._M_p) ||
                (*(uint *)((long)&(pMVar2->optional).super__Bvector_base<std::allocator<bool>_>.
                                  _M_impl + 0x18) != 0)) && ((*p_Var3 & 1) != 0)) goto LAB_0015b4ea;
          }
          else {
LAB_0015b4ea:
            std::operator+(&local_1a8,"( ",&assertionCheck);
            std::operator+(&local_150[0].first,&local_1a8," )");
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&assertionCheck,&local_150[0].first);
            std::__cxx11::string::~string((string *)local_150);
            std::__cxx11::string::~string((string *)&local_1a8);
            std::operator+(&local_1a8,"( ",&throwCheck);
            std::operator+(&local_150[0].first,&local_1a8," )");
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&throwCheck,&local_150[0].first);
            std::__cxx11::string::~string((string *)local_150);
            std::__cxx11::string::~string((string *)&local_1a8);
            p_Var6 = (arrayIts->
                     super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pMVar2 = p_Var6[uVar8]._M_current;
            p_Var3 = *(_Bit_type **)
                      &(pMVar2->optional).super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data;
            if (((p_Var3 != (((_Bit_iterator *)
                             ((long)&(pMVar2->optional).super__Bvector_base<std::allocator<bool>_>.
                                     _M_impl + 0x10))->super__Bit_iterator_base)._M_p) ||
                (*(uint *)((long)&(pMVar2->optional).super__Bvector_base<std::allocator<bool>_>.
                                  _M_impl + 0x18) != 0)) && ((*p_Var3 & 1) != 0)) {
              std::operator+(&local_1a8,&secondName,".empty() || ");
              std::operator+(&local_150[0].first,&local_1a8,&assertionCheck);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&assertionCheck,&local_150[0].first);
              std::__cxx11::string::~string((string *)local_150);
              std::__cxx11::string::~string((string *)&local_1a8);
              std::operator+(&local_170,"!",&secondName);
              std::operator+(&local_1a8,&local_170,".empty() && ");
              std::operator+(&local_150[0].first,&local_1a8,&throwCheck);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&throwCheck,&local_150[0].first);
              std::__cxx11::string::~string((string *)local_150);
              std::__cxx11::string::~string((string *)&local_1a8);
              std::__cxx11::string::~string((string *)&local_170);
              p_Var6 = (arrayIts->
                       super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
            }
            pMVar2 = p_Var6[local_178]._M_current;
            p_Var3 = *(_Bit_type **)
                      &(pMVar2->optional).super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data;
            if (((p_Var3 != (((_Bit_iterator *)
                             ((long)&(pMVar2->optional).super__Bvector_base<std::allocator<bool>_>.
                                     _M_impl + 0x10))->super__Bit_iterator_base)._M_p) ||
                (*(uint *)((long)&(pMVar2->optional).super__Bvector_base<std::allocator<bool>_>.
                                  _M_impl + 0x18) != 0)) && ((*p_Var3 & 1) != 0)) {
              std::operator+(&local_1a8,&sum,".empty() || ");
              std::operator+(&local_150[0].first,&local_1a8,&assertionCheck);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&assertionCheck,&local_150[0].first);
              std::__cxx11::string::~string((string *)local_150);
              std::__cxx11::string::~string((string *)&local_1a8);
              std::operator+(&local_170,"!",&sum);
              std::operator+(&local_1a8,&local_170,".empty() && ");
              std::operator+(&local_150[0].first,&local_1a8,&throwCheck);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&throwCheck,&local_150[0].first);
              std::__cxx11::string::~string((string *)local_150);
              std::__cxx11::string::~string((string *)&local_1a8);
              std::__cxx11::string::~string((string *)&local_170);
            }
          }
          std::operator+(&local_1a8,"      VULKAN_HPP_ASSERT( ",&assertionCheck);
          std::operator+(&local_150[0].first,&local_1a8," );\n");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&assertionText,&local_150[0].first);
          std::__cxx11::string::~string((string *)local_150);
          std::__cxx11::string::~string((string *)&local_1a8);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[11],_true>(local_150,(char (*) [11])"structName",local_180);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    (local_150 + 1,(char (*) [11])"throwCheck",&throwCheck);
          __l._M_len = 2;
          __l._M_array = local_150;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_60,__l,
                (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_170,&local_231);
          replaceWithMap(&local_1a8,
                         &generateSizeCheck(std::vector<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>,std::allocator<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>>>const&,std::__cxx11::string_const&,bool)
                          ::throwTextTemplate_abi_cxx11_,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_60);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&throwText,&local_1a8);
          std::__cxx11::string::~string((string *)&local_1a8);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&local_60);
          lVar7 = 0x40;
          do {
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)((long)&local_150[0].first._M_dataplus._M_p + lVar7));
            lVar7 = lVar7 + -0x40;
          } while (lVar7 != -0x40);
          std::__cxx11::string::~string((string *)&throwCheck);
          std::__cxx11::string::~string((string *)&assertionCheck);
          std::__cxx11::string::~string((string *)&secondName);
          __return_storage_ptr__ = local_230;
        }
        std::__cxx11::string::~string((string *)&sum);
        uVar8 = local_188;
      }
    }
    std::operator+(&throwCheck,"\n#ifdef VULKAN_HPP_NO_EXCEPTIONS\n",&assertionText);
    std::operator+(&assertionCheck,&throwCheck,"#else\n");
    std::operator+(&secondName,&assertionCheck,&throwText);
    std::operator+(&sum,&secondName,"#endif /*VULKAN_HPP_NO_EXCEPTIONS*/\n");
    std::operator+(&local_150[0].first,&sum,"    ");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,&local_150[0].first);
    std::__cxx11::string::~string((string *)local_150);
    std::__cxx11::string::~string((string *)&sum);
    std::__cxx11::string::~string((string *)&secondName);
    std::__cxx11::string::~string((string *)&assertionCheck);
    std::__cxx11::string::~string((string *)&throwCheck);
    std::__cxx11::string::~string((string *)&throwText);
    std::__cxx11::string::~string((string *)&assertionText);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateSizeCheck( std::vector<std::vector<MemberData>::const_iterator> const & arrayIts,
                                                   std::string const &                                          structName,
                                                   bool                                                         mutualExclusiveLens ) const
{
  std::string sizeCheck;
  if ( 1 < arrayIts.size() )
  {
    static const std::string throwTextTemplate = R"(      if ( ${throwCheck} )
      {
        throw LogicError( VULKAN_HPP_NAMESPACE_STRING"::${structName}::${structName}: ${throwCheck}" );
      }
)";

    std::string assertionText, throwText;
    if ( mutualExclusiveLens )
    {
      // exactly one of the arrays has to be non-empty
      std::string sum;
      for ( auto it : arrayIts )
      {
        sum += "!" + startLowerCase( stripPrefix( it->name, "p" ) ) + "_.empty() + ";
      }
      sum.resize( sum.size() - 3 );
      assertionText += "      VULKAN_HPP_ASSERT( ( " + sum + " ) <= 1);\n";
      throwText += replaceWithMap( throwTextTemplate, { { "structName", structName }, { "throwCheck", "1 < ( " + sum + " )" } } );
    }
    else
    {
      for ( size_t first = 0; first + 1 < arrayIts.size(); ++first )
      {
        assert( arrayIts[first]->name.starts_with( "p" ) );
        std::string firstName = startLowerCase( stripPrefix( arrayIts[first]->name, "p" ) ) + "_";
        for ( auto second = first + 1; second < arrayIts.size(); ++second )
        {
          assert( arrayIts[second]->name.starts_with( "p" ) );
          std::string secondName     = startLowerCase( stripPrefix( arrayIts[second]->name, "p" ) ) + "_";
          std::string assertionCheck = firstName + ".size() == " + secondName + ".size()";
          std::string throwCheck     = firstName + ".size() != " + secondName + ".size()";
          if ( ( !arrayIts[first]->optional.empty() && arrayIts[first]->optional.front() ) ||
               ( !arrayIts[second]->optional.empty() && arrayIts[second]->optional.front() ) )
          {
            assertionCheck = "( " + assertionCheck + " )";
            throwCheck     = "( " + throwCheck + " )";
            if ( !arrayIts[second]->optional.empty() && arrayIts[second]->optional.front() )
            {
              assertionCheck = secondName + ".empty() || " + assertionCheck;
              throwCheck     = "!" + secondName + ".empty() && " + throwCheck;
            }
            if ( !arrayIts[first]->optional.empty() && arrayIts[first]->optional.front() )
            {
              assertionCheck = firstName + ".empty() || " + assertionCheck;
              throwCheck     = "!" + firstName + ".empty() && " + throwCheck;
            }
          }
          assertionText += "      VULKAN_HPP_ASSERT( " + assertionCheck + " );\n";
          throwText += replaceWithMap( throwTextTemplate, { { "structName", structName }, { "throwCheck", throwCheck } } );
        }
      }
    }
    sizeCheck += "\n#ifdef VULKAN_HPP_NO_EXCEPTIONS\n" + assertionText + "#else\n" + throwText + "#endif /*VULKAN_HPP_NO_EXCEPTIONS*/\n" + "    ";
  }
  return sizeCheck;
}